

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

int __thiscall
JsUtil::
BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
::FindEntryWithKey<Js::PropertyRecord_const*>
          (BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
           *this,PropertyRecord **key)

{
  long lVar1;
  hash_t hashCode;
  long lVar2;
  JavascriptString *pJVar3;
  PropertyRecord *pPVar4;
  code *pcVar5;
  bool bVar6;
  uint uVar7;
  charcount_t cVar8;
  hash_t hVar9;
  int iVar10;
  undefined4 *puVar11;
  char16 *pcVar12;
  PropertyRecord *string1;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  DictionaryStats *this_00;
  uint uVar16;
  
  lVar2 = *(long *)this;
  uVar7 = 0;
  if (lVar2 != 0) {
    hashCode = (*key)->hash * 2 + 1;
    uVar7 = BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
            ::GetBucket(hashCode,*(int *)(this + 0x1c),*(int *)(this + 0x2c));
    uVar16 = *(uint *)(lVar2 + (ulong)uVar7 * 4);
    uVar7 = 0;
    if (-1 < (int)uVar16) {
      lVar2 = *(long *)(this + 8);
      uVar7 = 0;
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      do {
        pJVar3 = *(JavascriptString **)(lVar2 + 8 + (ulong)uVar16 * 0x18);
        pcVar12 = Js::JavascriptString::GetString(pJVar3);
        cVar8 = Js::JavascriptString::GetLength(pJVar3);
        if (cVar8 == 0) {
          hVar9 = 0x2393b8b;
        }
        else {
          uVar13 = 0x811c9dc5;
          uVar14 = 0;
          do {
            uVar15 = (ushort)pcVar12[uVar14] ^ uVar13;
            uVar13 = uVar15 * 0x1000193;
            uVar14 = uVar14 + 1;
          } while (cVar8 != uVar14);
          hVar9 = uVar15 * 0x2000326 + 1;
        }
        lVar1 = lVar2 + (ulong)uVar16 * 0x18;
        if (hVar9 != *(hash_t *)(lVar1 + 0x10)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar11 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DictionaryEntry.h"
                             ,199,
                             "(((static_cast<hash_t>(Comparer::GetHashCode(this->Key())) << 1) | 1) == this->hashCode)"
                             ,"TAGHASH(Comparer::GetHashCode(this->Key())) == this->hashCode");
          if (!bVar6) {
            pcVar5 = (code *)invalidInstructionException();
            (*pcVar5)();
          }
          *puVar11 = 0;
          hVar9 = *(hash_t *)(lVar1 + 0x10);
        }
        if (hVar9 == hashCode) {
          pJVar3 = *(JavascriptString **)(lVar1 + 8);
          pPVar4 = *key;
          cVar8 = Js::JavascriptString::GetLength(pJVar3);
          if ((cVar8 == pPVar4->byteCount >> 1) && (0xf < (uint)pPVar4->pid)) {
            string1 = (PropertyRecord *)Js::JavascriptString::GetString(pJVar3);
            cVar8 = Js::JavascriptString::GetLength(pJVar3);
            if (string1 != pPVar4 + 1) {
              iVar10 = PAL_wmemcmp((char16_t *)string1,(char16_t *)(pPVar4 + 1),(ulong)cVar8);
              if (iVar10 != 0) goto LAB_00e2d0f8;
            }
            this_00 = *(DictionaryStats **)(this + 0x30);
            goto LAB_00e2d115;
          }
        }
LAB_00e2d0f8:
        uVar7 = uVar7 + 1;
        uVar16 = *(uint *)(lVar1 + 4);
      } while (-1 < (int)uVar16);
    }
  }
  this_00 = *(DictionaryStats **)(this + 0x30);
  uVar16 = 0xffffffff;
LAB_00e2d115:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,uVar7);
  }
  return uVar16;
}

Assistant:

inline int FindEntryWithKey(const LookupType& key) const
        {
#if PROFILE_DICTIONARY
            uint depth = 0;
#endif
            int * localBuckets = buckets;
            if (localBuckets != nullptr)
            {
                hash_t hashCode = GetHashCodeWithKey<LookupType>(key);
                uint targetBucket = this->GetBucket(hashCode);
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        return i;
                    }

#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }
            }

#if PROFILE_DICTIONARY
            if (stats)
                stats->Lookup(depth);
#endif
            return -1;
        }